

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O0

int ftp_open_network(char *filename,FILE **ftpfile,FILE **command,int *sock)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  FILE *pFVar4;
  float fVar5;
  float local_19c8;
  int local_19c4;
  float version;
  int tryingtologin;
  int ii;
  int port;
  char turl [1200];
  char ip [100];
  char *saveptr;
  char *tstr;
  char *passive;
  char *newfn;
  char fn [1200];
  char *password;
  char *username;
  char *newhost;
  char agentStr [100];
  char local_f38 [8];
  char host [100];
  char local_ec8 [8];
  char proto [100];
  char local_e58 [8];
  char tmpstr [1200];
  char errorstr [1200];
  char recbuf [1200];
  int local_3c;
  int local_38;
  int tmpint;
  int sock1;
  int status;
  int *sock_local;
  FILE **command_local;
  FILE **ftpfile_local;
  char *filename_local;
  
  local_19c4 = 1;
  local_19c8 = 0.0;
  _sock1 = sock;
  sock_local = (int *)command;
  command_local = ftpfile;
  ftpfile_local = (FILE **)filename;
  sVar2 = strlen(filename);
  if (sVar2 < 0x4aa) {
    strcpy((char *)&ii,"ftp://");
    strcat((char *)&ii,(char *)ftpfile_local);
    iVar1 = NET_ParseUrl((char *)&ii,local_ec8,local_f38,&tryingtologin,(char *)&newfn);
    if (iVar1 == 0) {
      tryingtologin = 0x15;
      fVar5 = ffvers(&local_19c8);
      snprintf((char *)&newhost,100,"User-Agent: FITSIO/HEASARC/%-8.4f",(double)fVar5);
      pcVar3 = strrchr(local_f38,0x40);
      if (pcVar3 == (char *)0x0) {
        username = local_f38;
      }
      else {
        *pcVar3 = '\0';
        username = pcVar3 + 1;
        pcVar3 = strchr(local_f38,0x3a);
        if (pcVar3 != (char *)0x0) {
          pcVar3 = strchr(local_f38,0x3a);
          *pcVar3 = '\0';
        }
      }
      for (version = 0.0; (int)version < 10; version = (float)((int)version + 1)) {
        iVar1 = NET_TcpConnect(username,tryingtologin);
        *_sock1 = iVar1;
        pFVar4 = fdopen(*_sock1,"r");
        *(FILE **)sock_local = pFVar4;
        if (pFVar4 == (FILE *)0x0) {
          ffpmsg("fdopen failed to convert socket to stdio file (ftp_open_netowrk)");
          return 0x68;
        }
        iVar1 = ftp_status(*(FILE **)sock_local,"220 ");
        if (iVar1 == 0) {
          local_19c4 = 0;
          break;
        }
        fclose(*(FILE **)sock_local);
        NET_SendRaw(*_sock1,"QUIT\r\n",6,0);
        sleep(5);
      }
      if (local_19c4 == 0) {
        snprintf(local_e58,0x4b0,"USER %s\r\n");
        iVar1 = *_sock1;
        sVar2 = strlen(local_e58);
        tmpint = NET_SendRaw(iVar1,local_e58,(int)sVar2,0);
        iVar1 = ftp_status(*(FILE **)sock_local,"331 ");
        if (iVar1 == 0) {
          snprintf(local_e58,0x4b0,"PASS %s\r\n");
          iVar1 = *_sock1;
          sVar2 = strlen(local_e58);
          tmpint = NET_SendRaw(iVar1,local_e58,(int)sVar2,0);
          iVar1 = ftp_status(*(FILE **)sock_local,"230 ");
          if (iVar1 == 0) {
            pcVar3 = strrchr((char *)&newfn,0x2f);
            if (pcVar3 == (char *)0x0) {
              strcpy(local_e58,"CWD /\r\n");
              passive = (char *)&newfn;
            }
            else {
              *pcVar3 = '\0';
              passive = pcVar3 + 1;
              sVar2 = strlen((char *)&newfn);
              if (sVar2 == 0) {
                strcpy(local_e58,"CWD /\r\n");
              }
              else if ((char)newfn == '/') {
                snprintf(local_e58,0x4b0,"CWD %s\r\n");
              }
              else {
                snprintf(local_e58,0x4b0,"CWD %s\r\n");
              }
            }
            iVar1 = *_sock1;
            sVar2 = strlen(local_e58);
            tmpint = NET_SendRaw(iVar1,local_e58,(int)sVar2,0);
            iVar1 = ftp_status(*(FILE **)sock_local,"250 ");
            if (iVar1 == 0) {
              sVar2 = strlen(passive);
              if (sVar2 == 0) {
                ffpmsg("Null file name (ftp_open)");
                fclose(*(FILE **)sock_local);
                NET_SendRaw(*_sock1,"QUIT\r\n",6,0);
                filename_local._4_4_ = 0x68;
              }
              else {
                snprintf(local_e58,0x4b0,"TYPE I\r\n");
                iVar1 = *_sock1;
                sVar2 = strlen(local_e58);
                tmpint = NET_SendRaw(iVar1,local_e58,(int)sVar2,0);
                iVar1 = ftp_status(*(FILE **)sock_local,"200 ");
                if (iVar1 == 0) {
                  tmpint = NET_SendRaw(*_sock1,"PASV\r\n",6,0);
                  pcVar3 = fgets(errorstr + 0x4a8,0x4b0,*(FILE **)sock_local);
                  if (pcVar3 == (char *)0x0) {
                    ffpmsg("PASV error (ftp_open)");
                    fclose(*(FILE **)sock_local);
                    NET_SendRaw(*_sock1,"QUIT\r\n",6,0);
                    filename_local._4_4_ = 0x68;
                  }
                  else if (((errorstr[0x4a8] == '2') && (errorstr[0x4a9] == '2')) &&
                          (errorstr[0x4aa] == '7')) {
                    pcVar3 = strchr(errorstr + 0x4a8,0x28);
                    if (pcVar3 == (char *)0x0) {
                      ffpmsg("PASV error (ftp_open_network)");
                      fclose(*(FILE **)sock_local);
                      NET_SendRaw(*_sock1,"QUIT\r\n",6,0);
                      filename_local._4_4_ = 0x68;
                    }
                    else {
                      *pcVar3 = '\0';
                      turl[0x4a8] = '\0';
                      pcVar3 = strtok(pcVar3 + 1,",)");
                      if (pcVar3 == (char *)0x0) {
                        ffpmsg("PASV error (ftp_open_network)");
                        fclose(*(FILE **)sock_local);
                        NET_SendRaw(*_sock1,"QUIT\r\n",6,0);
                        filename_local._4_4_ = 0x68;
                      }
                      else {
                        strcpy(turl + 0x4a8,pcVar3);
                        strcat(turl + 0x4a8,".");
                        pcVar3 = strtok((char *)0x0,",)");
                        if (pcVar3 == (char *)0x0) {
                          ffpmsg("PASV error (ftp_open_network)");
                          fclose(*(FILE **)sock_local);
                          NET_SendRaw(*_sock1,"QUIT\r\n",6,0);
                          filename_local._4_4_ = 0x68;
                        }
                        else {
                          strcat(turl + 0x4a8,pcVar3);
                          strcat(turl + 0x4a8,".");
                          pcVar3 = strtok((char *)0x0,",)");
                          if (pcVar3 == (char *)0x0) {
                            ffpmsg("PASV error (ftp_open_network)");
                            fclose(*(FILE **)sock_local);
                            NET_SendRaw(*_sock1,"QUIT\r\n",6,0);
                            filename_local._4_4_ = 0x68;
                          }
                          else {
                            strcat(turl + 0x4a8,pcVar3);
                            strcat(turl + 0x4a8,".");
                            pcVar3 = strtok((char *)0x0,",)");
                            if (pcVar3 == (char *)0x0) {
                              ffpmsg("PASV error (ftp_open_network)");
                              fclose(*(FILE **)sock_local);
                              NET_SendRaw(*_sock1,"QUIT\r\n",6,0);
                              filename_local._4_4_ = 0x68;
                            }
                            else {
                              strcat(turl + 0x4a8,pcVar3);
                              pcVar3 = strtok((char *)0x0,",)");
                              if (pcVar3 == (char *)0x0) {
                                ffpmsg("PASV error (ftp_open_network)");
                                fclose(*(FILE **)sock_local);
                                NET_SendRaw(*_sock1,"QUIT\r\n",6,0);
                                filename_local._4_4_ = 0x68;
                              }
                              else {
                                __isoc99_sscanf(pcVar3,"%d",&tryingtologin);
                                tryingtologin = tryingtologin << 8;
                                pcVar3 = strtok((char *)0x0,",)");
                                if (pcVar3 == (char *)0x0) {
                                  ffpmsg("PASV error (ftp_open_network)");
                                  fclose(*(FILE **)sock_local);
                                  NET_SendRaw(*_sock1,"QUIT\r\n",6,0);
                                  filename_local._4_4_ = 0x68;
                                }
                                else {
                                  __isoc99_sscanf(pcVar3,"%d",&local_3c);
                                  tryingtologin = local_3c + tryingtologin;
                                  sVar2 = strlen(passive);
                                  if (sVar2 == 0) {
                                    ffpmsg("Null file name (ftp_open_network)");
                                    fclose(*(FILE **)sock_local);
                                    NET_SendRaw(*_sock1,"QUIT\r\n",6,0);
                                    filename_local._4_4_ = 0x68;
                                  }
                                  else {
                                    local_38 = NET_TcpConnect(turl + 0x4a8,tryingtologin);
                                    pFVar4 = fdopen(local_38,"r");
                                    *command_local = (FILE *)pFVar4;
                                    if (pFVar4 == (FILE *)0x0) {
                                      ffpmsg("Could not connect to passive port (ftp_open_network)")
                                      ;
                                      fclose(*(FILE **)sock_local);
                                      NET_SendRaw(*_sock1,"QUIT\r\n",6,0);
                                      filename_local._4_4_ = 0x68;
                                    }
                                    else {
                                      snprintf(local_e58,0x4b0,"RETR %s\r\n");
                                      iVar1 = *_sock1;
                                      sVar2 = strlen(local_e58);
                                      tmpint = NET_SendRaw(iVar1,local_e58,(int)sVar2,0);
                                      iVar1 = ftp_status(*(FILE **)sock_local,"150 ");
                                      if (iVar1 == 0) {
                                        filename_local._4_4_ = 0;
                                      }
                                      else {
                                        fclose((FILE *)*command_local);
                                        NET_SendRaw(local_38,"QUIT\r\n",6,0);
                                        fclose(*(FILE **)sock_local);
                                        NET_SendRaw(*_sock1,"QUIT\r\n",6,0);
                                        filename_local._4_4_ = 0x68;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  else {
                    fclose(*(FILE **)sock_local);
                    NET_SendRaw(*_sock1,"QUIT\r\n",6,0);
                    filename_local._4_4_ = 0x68;
                  }
                }
                else {
                  ffpmsg("TYPE I error, 200 not seen (ftp_open_network)");
                  fclose(*(FILE **)sock_local);
                  NET_SendRaw(*_sock1,"QUIT\r\n",6,0);
                  filename_local._4_4_ = 0x68;
                }
              }
            }
            else {
              ffpmsg("CWD error, no 250 seen (ftp_open_network)");
              fclose(*(FILE **)sock_local);
              NET_SendRaw(*_sock1,"QUIT\r\n",6,0);
              filename_local._4_4_ = 0x68;
            }
          }
          else {
            ffpmsg("PASS error, no 230 seen (ftp_open_network)");
            fclose(*(FILE **)sock_local);
            NET_SendRaw(*_sock1,"QUIT\r\n",6,0);
            filename_local._4_4_ = 0x68;
          }
        }
        else {
          ffpmsg("USER error no 331 seen (ftp_open_network)");
          fclose(*(FILE **)sock_local);
          NET_SendRaw(*_sock1,"QUIT\r\n",6,0);
          filename_local._4_4_ = 0x68;
        }
      }
      else {
        ffpmsg("error connecting to remote server, no 220 seen (ftp_open_network)");
        filename_local._4_4_ = 0x68;
      }
    }
    else {
      snprintf(tmpstr + 0x4a8,0x4b0,"URL Parse Error (ftp_open) %s",ftpfile_local);
      ffpmsg(tmpstr + 0x4a8);
      filename_local._4_4_ = 0x68;
    }
  }
  else {
    ffpmsg("ftp filename is too long (ftp_open_network)");
    filename_local._4_4_ = 0x68;
  }
  return filename_local._4_4_;
}

Assistant:

static int ftp_open_network(char *filename, FILE **ftpfile, FILE **command, int *sock)
{
  int status;
  int sock1;
  int tmpint;
  char recbuf[MAXLEN];
  char errorstr[MAXLEN];
  char tmpstr[MAXLEN];
  char proto[SHORTLEN];
  char host[SHORTLEN];
  char agentStr[SHORTLEN];
  char *newhost;
  char *username;
  char *password;
  char fn[MAXLEN];
  char *newfn;
  char *passive;
  char *tstr;
  char *saveptr;
  char ip[SHORTLEN];
  char turl[MAXLEN];
  int port;
  int ii,tryingtologin = 1;
  float version=0.0;

  /* parse the URL */
  if (strlen(filename) > MAXLEN - 7) {
    ffpmsg("ftp filename is too long (ftp_open_network)");
    return (FILE_NOT_OPENED);
  }

  strcpy(turl,"ftp://");
  strcat(turl,filename);
  if (NET_ParseUrl(turl,proto,host,&port,fn)) {
    snprintf(errorstr,MAXLEN,"URL Parse Error (ftp_open) %s",filename);
    ffpmsg(errorstr);
    return (FILE_NOT_OPENED);
  }
  
  port = 21;
  /* We might have a user name.  If not, set defaults for username and password */
  username = "anonymous";
  snprintf(agentStr,SHORTLEN,"User-Agent: FITSIO/HEASARC/%-8.4f",ffvers(&version));
  password = agentStr;
  /* is there an @ sign */
  if (NULL != (newhost = strrchr(host,'@'))) {
    *newhost = '\0'; /* make it a null, */
    newhost++; /* Now newhost points to the host name and host points to the 
		  user name, password combo */
    username = host;
    /* is there a : for a password */
    if (NULL != strchr(username,':')) {
      password = strchr(username,':');
      *password = '\0';
      password++;
    }
  } else {
    newhost = host;
  }

  for (ii = 0; ii < 10; ii++) {  /* make up to 10 attempts to log in */
  
    /* Connect to the host on the required port */
    *sock = NET_TcpConnect(newhost,port);
    /* convert it to a stdio file */
    if (NULL == (*command = fdopen(*sock,"r"))) {
      ffpmsg ("fdopen failed to convert socket to stdio file (ftp_open_netowrk)");
      return (FILE_NOT_OPENED);
    }

    /* Wait for the 220 response */
    if (ftp_status(*command,"220 ")) {
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);

/*      ffpmsg("sleeping for 5 in ftp_open_network, then try again"); */

      sleep (5);  /* take a nap and hope ftp server sorts itself out in the meantime */

    } else {
      tryingtologin = 0;
      break;
    }
  }

  if (tryingtologin) { /* the 10 attempts were not successful */
     ffpmsg ("error connecting to remote server, no 220 seen (ftp_open_network)");
     return (FILE_NOT_OPENED);
  }

  /* Send the user name and wait for the right response */
  snprintf(tmpstr,MAXLEN,"USER %s\r\n",username);

  status = NET_SendRaw(*sock,tmpstr,strlen(tmpstr),NET_DEFAULT);

  if (ftp_status(*command,"331 ")) {
    ffpmsg ("USER error no 331 seen (ftp_open_network)");
    fclose(*command);
    NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
    return (FILE_NOT_OPENED);
  }
  
  /* Send the password and wait for the right response */
  snprintf(tmpstr,MAXLEN,"PASS %s\r\n",password);
  status = NET_SendRaw(*sock,tmpstr,strlen(tmpstr),NET_DEFAULT);
  
  if (ftp_status(*command,"230 ")) {
    ffpmsg ("PASS error, no 230 seen (ftp_open_network)");
    fclose(*command);
    NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
    return (FILE_NOT_OPENED);
  }

  /* now do the cwd command */
  newfn = strrchr(fn,'/');
  if (newfn == NULL) {
    strcpy(tmpstr,"CWD /\r\n");
    newfn = fn;
  } else {
    *newfn = '\0';
    newfn++;
    if (strlen(fn) == 0) {
      strcpy(tmpstr,"CWD /\r\n");
    } else {
      /* remove the leading slash */
      if (fn[0] == '/') {
	snprintf(tmpstr,MAXLEN,"CWD %s\r\n",&fn[1]);
      } else {
	snprintf(tmpstr,MAXLEN,"CWD %s\r\n",fn);
      } 
    }
  }
  
  status = NET_SendRaw(*sock,tmpstr,strlen(tmpstr),NET_DEFAULT);
  
  if (ftp_status(*command,"250 ")) {
    ffpmsg ("CWD error, no 250 seen (ftp_open_network)");
    fclose(*command);
    NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
    return (FILE_NOT_OPENED);
  }
  
  if (!strlen(newfn)) {
    ffpmsg("Null file name (ftp_open)");
    fclose(*command);
    NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
    return (FILE_NOT_OPENED);
  }

  /* Always use binary mode */
  snprintf(tmpstr,MAXLEN,"TYPE I\r\n");
  status = NET_SendRaw(*sock,tmpstr,strlen(tmpstr),NET_DEFAULT);
  
  if (ftp_status(*command,"200 ")) {
    ffpmsg ("TYPE I error, 200 not seen (ftp_open_network)");
    fclose(*command);
    NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
    return (FILE_NOT_OPENED);
  }
 
  status = NET_SendRaw(*sock,"PASV\r\n",6,NET_DEFAULT);

  if (!(fgets(recbuf,MAXLEN,*command))) {
    ffpmsg ("PASV error (ftp_open)");
    fclose(*command);
    NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
    return (FILE_NOT_OPENED);
  }
  
  /*  Passive mode response looks like
      227 Entering Passive Mode (129,194,67,8,210,80) */
  if (recbuf[0] == '2' && recbuf[1] == '2' && recbuf[2] == '7') {
    /* got a good passive mode response, find the opening ( */
    
    if (!(passive = strchr(recbuf,'('))) {
      ffpmsg ("PASV error (ftp_open_network)");
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
      return (FILE_NOT_OPENED);
    }
    
    *passive = '\0';
    passive++;
    ip[0] = '\0';
      
    /* Messy parsing of response from PASV *command */
    
    if (!(tstr = ffstrtok(passive,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_open_network)");
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
      return (FILE_NOT_OPENED);
    }
    strcpy(ip,tstr);
    strcat(ip,".");
    
    if (!(tstr = ffstrtok(NULL,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_open_network)");
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
      return (FILE_NOT_OPENED);
    }
    strcat(ip,tstr);
    strcat(ip,".");
    
    if (!(tstr = ffstrtok(NULL,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_open_network)");
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
      return (FILE_NOT_OPENED);
    }
    strcat(ip,tstr);
    strcat(ip,".");
    
    if (!(tstr = ffstrtok(NULL,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_open_network)");
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
      return (FILE_NOT_OPENED);
    }
    strcat(ip,tstr);
    
    /* Done the ip number, now do the port # */
    if (!(tstr = ffstrtok(NULL,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_open_network)");
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
      return (FILE_NOT_OPENED);
    }
    sscanf(tstr,"%d",&port);
    port *= 256;
    
    if (!(tstr = ffstrtok(NULL,",)",&saveptr))) {
      ffpmsg ("PASV error (ftp_open_network)");
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
      return (FILE_NOT_OPENED);
    }
    sscanf(tstr,"%d",&tmpint);
    port += tmpint;

    if (!strlen(newfn)) {
      ffpmsg("Null file name (ftp_open_network)");
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
      return (FILE_NOT_OPENED);
    }
    
    /* Connect to the data port */
    sock1 = NET_TcpConnect(ip,port);
    if (NULL == (*ftpfile = fdopen(sock1,"r"))) {
      ffpmsg ("Could not connect to passive port (ftp_open_network)");
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
      return (FILE_NOT_OPENED);
    }

    /* Send the retrieve command */
    snprintf(tmpstr,MAXLEN,"RETR %s\r\n",newfn);
    status = NET_SendRaw(*sock,tmpstr,strlen(tmpstr),NET_DEFAULT);

    if (ftp_status(*command,"150 ")) {
      fclose(*ftpfile);
      NET_SendRaw(sock1,"QUIT\r\n",6,NET_DEFAULT);
      fclose(*command);
      NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
      return (FILE_NOT_OPENED);
    }
    return 0;    /* successfully opened the ftp file */
  }
  
  /* no passive mode */

  fclose(*command);
  NET_SendRaw(*sock,"QUIT\r\n",6,NET_DEFAULT);
  return (FILE_NOT_OPENED);
}